

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

ssize_t mqtt_pack_subscribe_request(uint8_t *buf,size_t bufsz,uint packet_id,...)

{
  char *pcVar1;
  uint32_t uVar2;
  char in_AL;
  uint uVar3;
  size_t sVar4;
  ssize_t sVar5;
  undefined8 in_RCX;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  uint16_t integer_htons;
  long *plVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar10;
  long lVar11;
  uint8_t *buf_00;
  uint8_t *puVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  mqtt_fixed_header fixed_header;
  va_list args;
  uint8_t max_qos [8];
  char *topic [8];
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  plVar8 = (long *)&stack0x00000008;
  uVar3 = 0x18;
  lVar10 = 0;
  while( true ) {
    if (uVar3 < 0x29) {
      uVar6 = (ulong)uVar3;
      uVar3 = uVar3 + 8;
      plVar7 = (long *)((long)local_e8 + uVar6);
      plVar9 = plVar8;
    }
    else {
      plVar9 = plVar8 + 1;
      plVar7 = plVar8;
    }
    pcVar1 = (char *)*plVar7;
    topic[lVar10] = pcVar1;
    if (pcVar1 == (char *)0x0) break;
    if (uVar3 < 0x29) {
      uVar6 = (ulong)uVar3;
      uVar3 = uVar3 + 8;
      plVar8 = plVar9;
      plVar9 = (long *)((long)local_e8 + uVar6);
    }
    else {
      plVar8 = plVar9 + 1;
    }
    max_qos[lVar10] = (uint8_t)*plVar9;
    lVar10 = lVar10 + 1;
    if (lVar10 == 8) {
      return -0x7ffffff5;
    }
  }
  fixed_header.control_type = MQTT_CONTROL_SUBSCRIBE;
  fixed_header._4_1_ = 2;
  fixed_header.remaining_length = 2;
  for (lVar11 = 0; uVar2 = fixed_header.remaining_length, lVar10 != lVar11; lVar11 = lVar11 + 1) {
    sVar4 = strlen(topic[lVar11]);
    fixed_header.remaining_length = uVar2 + (int)sVar4 + 3;
  }
  sVar5 = mqtt_pack_fixed_header(buf,bufsz,&fixed_header);
  if (sVar5 < 1) {
    return sVar5;
  }
  if (bufsz - sVar5 < (ulong)uVar2) {
    return 0;
  }
  *(ushort *)(buf + sVar5) = (ushort)packet_id << 8 | (ushort)packet_id >> 8;
  buf_00 = buf + sVar5 + 2;
  for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
    sVar5 = __mqtt_pack_str(buf_00,topic[lVar11]);
    puVar12 = buf_00 + sVar5;
    buf_00 = puVar12 + 1;
    *puVar12 = max_qos[lVar11];
  }
  return (long)buf_00 - (long)buf;
}

Assistant:

ssize_t mqtt_pack_subscribe_request(uint8_t *buf, size_t bufsz, unsigned int packet_id, ...) {
    va_list args;
    const uint8_t *const start = buf;
    ssize_t rv;
    struct mqtt_fixed_header fixed_header;
    unsigned int num_subs = 0;
    unsigned int i;
    const char *topic[MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS];
    uint8_t max_qos[MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS];

    /* parse all subscriptions */
    va_start(args, packet_id);
    for(;;) {
        topic[num_subs] = va_arg(args, const char*);
        if (topic[num_subs] == NULL) {
            /* end of list */
            break;
        }

        max_qos[num_subs] = (uint8_t) va_arg(args, unsigned int);

        ++num_subs;
        if (num_subs >= MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS) {
            va_end(args);
            return MQTT_ERROR_SUBSCRIBE_TOO_MANY_TOPICS;
        }
    }
    va_end(args);

    /* build the fixed header */
    fixed_header.control_type = MQTT_CONTROL_SUBSCRIBE;
    fixed_header.control_flags = 2u;
    fixed_header.remaining_length = 2u; /* size of variable header */
    for(i = 0; i < num_subs; ++i) {
        /* payload is topic name + max qos (1 byte) */
        fixed_header.remaining_length += __mqtt_packed_cstrlen(topic[i]) + 1;
    }

    /* pack the fixed header */
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        return rv;
    }
    buf += rv;
    bufsz -= (unsigned long)rv;

    /* check that the buffer has enough space */
    if (bufsz < fixed_header.remaining_length) {
        return 0;
    }
    
    
    /* pack variable header */
    buf += __mqtt_pack_uint16(buf, (uint16_t)packet_id);


    /* pack payload */
    for(i = 0; i < num_subs; ++i) {
        buf += __mqtt_pack_str(buf, topic[i]);
        *buf++ = max_qos[i];
    }

    return buf - start;
}